

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O0

SampledSpectrum
pbrt::ConnectBDPT(Integrator *integrator,SampledWavelengths *lambda,Vertex *lightVertices,
                 Vertex *cameraVertices,int s,int t,LightSamplerHandle *lightSampler,
                 CameraHandle *camera,SamplerHandle *sampler,optional<pbrt::Point2<float>_> *pRaster
                 ,Float *misWeightPtr)

{
  Point3<float> args;
  Normal3<float> args_00;
  LightSampleContext ctx_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  SampledWavelengths lambda_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  array<float,_4> aVar21;
  bool bVar22;
  undefined1 uVar23;
  CameraWiSample *pCVar24;
  SampledLight *pSVar25;
  SurfaceInteraction *si;
  long lVar26;
  long in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  int in_R8D;
  int in_R9D;
  long *in_FS_OFFSET;
  Point2f PVar27;
  undefined8 uVar39;
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  ulong uVar40;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar41;
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined8 uVar55;
  undefined1 in_ZMM1 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  Point3f PVar57;
  SampledSpectrum SVar58;
  Float *in_stack_00000028;
  Float misWeight;
  Vertex *pt_2;
  Vertex *qs_1;
  RNG rng_1;
  EndpointInteraction ei;
  LightLiSample lightWeight;
  LightSampleContext ctx;
  Float lightPDF;
  LightHandle light;
  optional<pbrt::SampledLight> sampledLight;
  Vertex *pt_1;
  RNG rng;
  optional<pbrt::CameraWiSample> cs;
  Vertex *qs;
  Vertex *pt;
  Vertex sampled;
  SampledSpectrum L;
  Vertex *in_stack_fffffffffffff2c8;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffff2d0;
  Vertex *in_stack_fffffffffffff2d8;
  Vertex *in_stack_fffffffffffff2e0;
  LightSamplerHandle *in_stack_fffffffffffff2e8;
  EndpointInteraction *ei_00;
  float fVar59;
  Interaction *in_stack_fffffffffffff310;
  Point2f *in_stack_fffffffffffff318;
  Interaction *in_stack_fffffffffffff320;
  CameraHandle *in_stack_fffffffffffff328;
  LightSamplingMode mode;
  undefined4 in_stack_fffffffffffff330;
  undefined4 in_stack_fffffffffffff334;
  float in_stack_fffffffffffff338;
  float in_stack_fffffffffffff33c;
  Float FVar60;
  Interaction *in_stack_fffffffffffff340;
  CameraHandle *in_stack_fffffffffffff348;
  undefined8 in_stack_fffffffffffff350;
  undefined8 in_stack_fffffffffffff358;
  undefined8 in_stack_fffffffffffff360;
  undefined8 in_stack_fffffffffffff368;
  undefined8 in_stack_fffffffffffff370;
  undefined8 in_stack_fffffffffffff378;
  undefined8 in_stack_fffffffffffff380;
  undefined8 in_stack_fffffffffffff388;
  undefined4 in_stack_fffffffffffff390;
  TransportMode in_stack_fffffffffffff394;
  Vertex *in_stack_fffffffffffff398;
  Vertex *in_stack_fffffffffffff3a0;
  SampledWavelengths *in_stack_fffffffffffff3d0;
  Vertex *in_stack_fffffffffffff3d8;
  undefined7 in_stack_fffffffffffff3e0;
  undefined1 in_stack_fffffffffffff3e7;
  SamplerHandle *in_stack_fffffffffffff3e8;
  Integrator *in_stack_fffffffffffff3f0;
  LightSamplerHandle *in_stack_fffffffffffff410;
  Vertex *in_stack_fffffffffffff418;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffff420;
  Vertex *in_stack_fffffffffffff428;
  Vertex *in_stack_fffffffffffff430;
  vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *in_stack_fffffffffffff438;
  Vertex *in_stack_fffffffffffff440;
  undefined4 in_stack_fffffffffffff560;
  undefined4 uVar61;
  type in_stack_fffffffffffff564;
  SampledWavelengths *in_stack_fffffffffffff568;
  Interaction *in_stack_fffffffffffff570;
  CameraWiSample *in_stack_fffffffffffff578;
  undefined7 in_stack_fffffffffffff580;
  undefined1 in_stack_fffffffffffff587;
  LightLiSample local_618;
  undefined1 local_59c [48];
  LightSampleContext local_56c;
  Vertex *local_53c;
  Tuple2<pbrt::Point2,_float> TStack_534;
  Vertex *pVStack_52c;
  Vertex *pVStack_524;
  undefined4 local_51c;
  undefined4 uStack_518;
  Float local_50c;
  optional local_500 [24];
  Vertex *local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  Tuple2<pbrt::Point2,_float> local_480;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 local_430;
  int in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  Vertex *in_stack_fffffffffffffce0;
  Vertex *in_stack_fffffffffffffce8;
  Vertex *in_stack_fffffffffffffcf0;
  Integrator *in_stack_fffffffffffffcf8;
  LightSamplerHandle *in_stack_fffffffffffffd10;
  optional local_2a8 [208];
  Vertex *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined8 local_1b8;
  long local_1b0;
  Float local_54;
  undefined8 local_48;
  undefined8 uStack_40;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  undefined8 *local_20;
  undefined8 local_10;
  undefined8 local_8;
  undefined1 auVar42 [56];
  undefined1 extraout_var [56];
  undefined1 auVar56 [56];
  
  auVar56 = in_ZMM1._8_56_;
  auVar42 = SUB6456(ZEXT1664((undefined1  [16])0x0),8);
  local_38 = in_R9D;
  local_34 = in_R8D;
  local_30 = in_RCX;
  local_28 = in_RDX;
  local_20 = in_RSI;
  SampledSpectrum::SampledSpectrum
            ((SampledSpectrum *)in_stack_fffffffffffff2d0,
             (Float)((ulong)in_stack_fffffffffffff2c8 >> 0x20));
  if (((local_38 < 2) || (local_34 == 0)) ||
     (*(int *)(local_30 + (long)(local_38 + -1) * 0x160) != 1)) {
    Vertex::Vertex((Vertex *)in_stack_fffffffffffff2d0);
    if (local_34 == 0) {
      local_1b0 = local_30 + (long)(local_38 + -1) * 0x160;
      bVar22 = Vertex::IsLight(in_stack_fffffffffffff2e0);
      if (bVar22) {
        SVar58 = Vertex::Le(in_stack_fffffffffffff440,in_stack_fffffffffffff438,
                            in_stack_fffffffffffff430,
                            (SampledWavelengths *)in_stack_fffffffffffff428);
        auVar43._0_8_ = SVar58.values.values._8_8_;
        auVar43._8_56_ = auVar56;
        auVar28._0_8_ = SVar58.values.values._0_8_;
        auVar28._8_56_ = auVar42;
        local_1d0 = vmovlpd_avx(auVar28._0_16_);
        local_1c8 = vmovlpd_avx(auVar43._0_16_);
        SVar58 = SampledSpectrum::operator*
                           ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                            (SampledSpectrum *)in_stack_fffffffffffff2d0);
        auVar44._0_8_ = SVar58.values.values._8_8_;
        auVar44._8_56_ = auVar56;
        auVar29._0_8_ = SVar58.values.values._0_8_;
        auVar29._8_56_ = auVar42;
        local_1c0 = vmovlpd_avx(auVar29._0_16_);
        local_1b8 = vmovlpd_avx(auVar44._0_16_);
        local_48 = local_1c0;
        uStack_40 = local_1b8;
      }
    }
    else if (local_38 == 1) {
      local_1d8 = (Vertex *)(local_28 + (long)(local_34 + -1) * 0x160);
      bVar22 = Vertex::IsConnectible(in_stack_fffffffffffff2d8);
      if (bVar22) {
        Vertex::GetInteraction(local_1d8);
        auVar30._0_8_ = SamplerHandle::Get2D((SamplerHandle *)in_stack_fffffffffffff2c8);
        auVar30._8_56_ = extraout_var;
        vmovlpd_avx(auVar30._0_16_);
        CameraHandle::SampleWi
                  (in_stack_fffffffffffff328,in_stack_fffffffffffff320,in_stack_fffffffffffff318,
                   (SampledWavelengths *)in_stack_fffffffffffff310);
        bVar22 = pstd::optional::operator_cast_to_bool(local_2a8);
        if (bVar22) {
          pstd::optional<pbrt::CameraWiSample>::operator->
                    ((optional<pbrt::CameraWiSample> *)0x7ef78d);
          pstd::optional<pbrt::Point2<float>_>::operator=
                    ((optional<pbrt::Point2<float>_> *)in_stack_fffffffffffff2d0,
                     (Point2<float> *)in_stack_fffffffffffff2c8);
          CameraHandle::CameraHandle
                    ((CameraHandle *)in_stack_fffffffffffff2d0,
                     (CameraHandle *)in_stack_fffffffffffff2c8);
          pstd::optional<pbrt::CameraWiSample>::operator->
                    ((optional<pbrt::CameraWiSample> *)0x7ef7d6);
          pstd::optional<pbrt::CameraWiSample>::operator->
                    ((optional<pbrt::CameraWiSample> *)0x7ef801);
          pstd::optional<pbrt::CameraWiSample>::operator->
                    ((optional<pbrt::CameraWiSample> *)0x7ef828);
          uVar39 = 0;
          SVar58 = SampledSpectrum::operator/
                             ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                              in_stack_fffffffffffff2d0.y);
          auVar45._0_8_ = SVar58.values.values._8_8_;
          auVar45._8_56_ = auVar56;
          uVar40 = auVar56._0_8_;
          auVar20._8_8_ = uVar39;
          auVar20._0_8_ = SVar58.values.values._0_8_;
          local_438 = vmovlpd_avx(auVar20);
          local_430 = vmovlpd_avx(auVar45._0_16_);
          Vertex::CreateCamera
                    (in_stack_fffffffffffff348,in_stack_fffffffffffff340,
                     (SampledSpectrum *)
                     CONCAT44(in_stack_fffffffffffff33c,in_stack_fffffffffffff338));
          Vertex::operator=((Vertex *)in_stack_fffffffffffff2d0,in_stack_fffffffffffff2c8);
          SVar58 = Vertex::f(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                             in_stack_fffffffffffff394);
          auVar18._8_8_ = uVar39;
          auVar18._0_8_ = SVar58.values.values._8_8_;
          auVar19._8_8_ = uVar40;
          auVar19._0_8_ = SVar58.values.values._0_8_;
          local_468 = vmovlpd_avx(auVar19);
          local_460 = vmovlpd_avx(auVar18);
          SVar58 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                              (SampledSpectrum *)in_stack_fffffffffffff2d0);
          auVar16._8_8_ = uVar40;
          auVar16._0_8_ = SVar58.values.values._8_8_;
          auVar17._8_8_ = uVar39;
          auVar17._0_8_ = SVar58.values.values._0_8_;
          local_458 = vmovlpd_avx(auVar17);
          local_450 = vmovlpd_avx(auVar16);
          SVar58 = SampledSpectrum::operator*
                             ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                              (SampledSpectrum *)in_stack_fffffffffffff2d0);
          auVar14._8_8_ = uVar39;
          auVar14._0_8_ = SVar58.values.values._8_8_;
          auVar15._8_8_ = uVar40;
          auVar15._0_8_ = SVar58.values.values._0_8_;
          auVar56 = ZEXT856(uVar40);
          local_448 = vmovlpd_avx(auVar15);
          uStack_440 = vmovlpd_avx(auVar14);
          local_48 = local_448;
          uStack_40 = uStack_440;
          uVar23 = Vertex::IsOnSurface(in_stack_fffffffffffff2e0);
          if ((bool)uVar23) {
            in_stack_fffffffffffff578 =
                 pstd::optional<pbrt::CameraWiSample>::operator->
                           ((optional<pbrt::CameraWiSample> *)0x7efa02);
            in_stack_fffffffffffff568 = (SampledWavelengths *)&in_stack_fffffffffffff578->wi;
            in_stack_fffffffffffff570 = (Interaction *)Vertex::ns(in_stack_fffffffffffff2c8);
            in_stack_fffffffffffff564 =
                 AbsDot<float>((Vector3<float> *)in_stack_fffffffffffff2d0,
                               (Normal3<float> *)in_stack_fffffffffffff2c8);
            SampledSpectrum::operator*=
                      ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                       (Float)((ulong)in_stack_fffffffffffff2d8 >> 0x20));
          }
          bVar22 = SampledSpectrum::operator_cast_to_bool
                             ((SampledSpectrum *)in_stack_fffffffffffff2d8);
          uVar61 = CONCAT13(bVar22,(int3)in_stack_fffffffffffff560);
          if (bVar22) {
            pCVar24 = pstd::optional<pbrt::CameraWiSample>::operator->
                                ((optional<pbrt::CameraWiSample> *)0x7efaca);
            local_480 = (pCVar24->pRaster).super_Tuple2<pbrt::Point2,_float>;
            uVar40 = 0;
            Hash<pbrt::Point2<float>>((Point2<float>)in_stack_fffffffffffff2d0);
            pstd::optional<pbrt::CameraWiSample>::operator->
                      ((optional<pbrt::CameraWiSample> *)0x7efb0d);
            Interaction::Interaction
                      ((Interaction *)in_stack_fffffffffffff2d0,
                       (Interaction *)in_stack_fffffffffffff2c8);
            Hash<pbrt::Interaction>(in_stack_fffffffffffff310);
            RNG::RNG((RNG *)in_stack_fffffffffffff2d0,(uint64_t)in_stack_fffffffffffff2c8,0x7efb66);
            pstd::optional<pbrt::CameraWiSample>::operator->
                      ((optional<pbrt::CameraWiSample> *)0x7efb85);
            pstd::optional<pbrt::CameraWiSample>::operator->
                      ((optional<pbrt::CameraWiSample> *)0x7efbb0);
            SVar58 = Integrator::Tr((Integrator *)CONCAT17(uVar23,in_stack_fffffffffffff580),
                                    (Interaction *)in_stack_fffffffffffff578,
                                    in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                                    (RNG *)CONCAT44(in_stack_fffffffffffff564,uVar61));
            auVar46._0_8_ = SVar58.values.values._8_8_;
            auVar46._8_56_ = auVar56;
            auVar13._8_8_ = uVar40;
            auVar13._0_8_ = SVar58.values.values._0_8_;
            auVar56 = ZEXT856(uVar40);
            local_4e0 = vmovlpd_avx(auVar13);
            local_4d8 = vmovlpd_avx(auVar46._0_16_);
            SampledSpectrum::operator*=
                      ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                       (SampledSpectrum *)in_stack_fffffffffffff2d8);
          }
        }
        pstd::optional<pbrt::CameraWiSample>::~optional((optional<pbrt::CameraWiSample> *)0x7efc4b);
      }
    }
    else if (local_34 == 1) {
      local_4e8 = (Vertex *)(local_30 + (long)(local_38 + -1) * 0x160);
      bVar22 = Vertex::IsConnectible(in_stack_fffffffffffff2d8);
      mode = (LightSamplingMode)((ulong)in_stack_fffffffffffff328 >> 0x20);
      if (bVar22) {
        SamplerHandle::Get1D((SamplerHandle *)in_stack_fffffffffffff2d0);
        LightSamplerHandle::Sample
                  (in_stack_fffffffffffff2e8,(Float)((ulong)in_stack_fffffffffffff2e0 >> 0x20));
        bVar22 = pstd::optional::operator_cast_to_bool(local_500);
        if (bVar22) {
          pstd::optional<pbrt::SampledLight>::operator->((optional<pbrt::SampledLight> *)0x7efcf8);
          LightHandle::LightHandle
                    ((LightHandle *)in_stack_fffffffffffff2d0,
                     (LightHandle *)in_stack_fffffffffffff2c8);
          pSVar25 = pstd::optional<pbrt::SampledLight>::operator->
                              ((optional<pbrt::SampledLight> *)0x7efd26);
          local_50c = pSVar25->pdf;
          LightSampleContext::LightSampleContext((LightSampleContext *)in_stack_fffffffffffff2d0);
          bVar22 = Vertex::IsOnSurface(in_stack_fffffffffffff2e0);
          if (bVar22) {
            Vertex::GetInteraction(local_4e8);
            si = Interaction::AsSurface((Interaction *)in_stack_fffffffffffff2d0);
            LightSampleContext::LightSampleContext(&local_56c,si);
            memcpy(&local_53c,&local_56c,0x30);
          }
          else {
            Vertex::GetInteraction(local_4e8);
            LightSampleContext::LightSampleContext
                      ((LightSampleContext *)in_stack_fffffffffffff2d0,
                       (Interaction *)in_stack_fffffffffffff2c8);
            memcpy(&local_53c,local_59c,0x30);
          }
          ei_00 = (EndpointInteraction *)CONCAT44(uStack_518,local_51c);
          PVar27 = SamplerHandle::Get2D((SamplerHandle *)in_stack_fffffffffffff2c8);
          auVar12._8_8_ = extraout_XMM0_Qb;
          auVar12._0_4_ = PVar27.super_Tuple2<pbrt::Point2,_float>.x;
          auVar12._4_4_ = PVar27.super_Tuple2<pbrt::Point2,_float>.y;
          vmovlpd_avx(auVar12);
          uVar39 = *local_20;
          fVar59 = (float)local_20[1];
          auVar56 = ZEXT856((ulong)TStack_534);
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low =
               (float)(int)in_stack_fffffffffffff358;
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high =
               (float)(int)((ulong)in_stack_fffffffffffff358 >> 0x20);
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low =
               (float)(int)in_stack_fffffffffffff350;
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high =
               (float)(int)((ulong)in_stack_fffffffffffff350 >> 0x20);
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low =
               (float)(int)in_stack_fffffffffffff360;
          ctx_00.pi.super_Point3<pbrt::Interval<float>_>.
          super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high =
               (float)(int)((ulong)in_stack_fffffffffffff360 >> 0x20);
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)in_stack_fffffffffffff368;
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.y =
               (float)(int)((ulong)in_stack_fffffffffffff368 >> 0x20);
          ctx_00.n.super_Tuple3<pbrt::Normal3,_float>.z = (float)(int)in_stack_fffffffffffff370;
          ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.x =
               (float)(int)((ulong)in_stack_fffffffffffff370 >> 0x20);
          ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)in_stack_fffffffffffff378;
          ctx_00.ns.super_Tuple3<pbrt::Normal3,_float>.z =
               (float)(int)((ulong)in_stack_fffffffffffff378 >> 0x20);
          PVar27.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffff33c;
          PVar27.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffff338;
          lambda_00.lambda.values[2] = (float)(int)in_stack_fffffffffffff388;
          lambda_00.lambda.values[3] = (float)(int)((ulong)in_stack_fffffffffffff388 >> 0x20);
          lambda_00.lambda.values[0] = (float)(int)in_stack_fffffffffffff380;
          lambda_00.lambda.values[1] = (float)(int)((ulong)in_stack_fffffffffffff380 >> 0x20);
          lambda_00.pdf.values[0] = (float)in_stack_fffffffffffff390;
          lambda_00.pdf.values[1] = (float)in_stack_fffffffffffff394;
          lambda_00.pdf.values._8_8_ = in_stack_fffffffffffff398;
          LightHandle::SampleLi
                    ((LightHandle *)CONCAT44(in_stack_fffffffffffff334,in_stack_fffffffffffff330),
                     ctx_00,PVar27,lambda_00,mode);
          bVar22 = LightLiSample::operator_cast_to_bool(&local_618);
          in_stack_fffffffffffff2c8 = local_53c;
          in_stack_fffffffffffff2d0 = TStack_534;
          in_stack_fffffffffffff2d8 = pVStack_52c;
          in_stack_fffffffffffff2e0 = pVStack_524;
          if (bVar22) {
            LightHandle::LightHandle((LightHandle *)TStack_534,(LightHandle *)local_53c);
            EndpointInteraction::EndpointInteraction
                      ((EndpointInteraction *)pVStack_524,(Interaction *)pVStack_52c,
                       (LightHandle *)TStack_534);
            uVar55 = 0;
            uVar41 = 0;
            SVar58 = SampledSpectrum::operator/((SampledSpectrum *)pVStack_52c,TStack_534.y);
            auVar10._8_8_ = uVar55;
            auVar10._0_8_ = SVar58.values.values._8_8_;
            auVar11._8_8_ = uVar41;
            auVar11._0_8_ = SVar58.values.values._0_8_;
            vmovlpd_avx(auVar11);
            vmovlpd_avx(auVar10);
            Vertex::CreateLight(ei_00,(SampledSpectrum *)pVStack_524,
                                (Float)((ulong)pVStack_52c >> 0x20));
            Vertex::operator=((Vertex *)TStack_534,local_53c);
            LightSamplerHandle::LightSamplerHandle
                      ((LightSamplerHandle *)TStack_534,(LightSamplerHandle *)local_53c);
            local_54 = Vertex::PdfLightOrigin
                                 (in_stack_fffffffffffff428,in_stack_fffffffffffff420,
                                  in_stack_fffffffffffff418,in_stack_fffffffffffff410);
            uVar40 = 0;
            SVar58 = Vertex::f(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                               in_stack_fffffffffffff394);
            auVar8._8_8_ = uVar41;
            auVar8._0_8_ = SVar58.values.values._8_8_;
            auVar9._8_8_ = uVar40;
            auVar9._0_8_ = SVar58.values.values._0_8_;
            vmovlpd_avx(auVar9);
            vmovlpd_avx(auVar8);
            SVar58 = SampledSpectrum::operator*
                               ((SampledSpectrum *)pVStack_52c,(SampledSpectrum *)TStack_534);
            auVar6._8_8_ = uVar40;
            auVar6._0_8_ = SVar58.values.values._8_8_;
            auVar7._8_8_ = uVar41;
            auVar7._0_8_ = SVar58.values.values._0_8_;
            vmovlpd_avx(auVar7);
            vmovlpd_avx(auVar6);
            SVar58 = SampledSpectrum::operator*
                               ((SampledSpectrum *)pVStack_52c,(SampledSpectrum *)TStack_534);
            auVar4._8_8_ = uVar41;
            auVar4._0_8_ = SVar58.values.values._8_8_;
            auVar5._8_8_ = uVar40;
            auVar5._0_8_ = SVar58.values.values._0_8_;
            auVar56 = ZEXT856(uVar40);
            local_48 = vmovlpd_avx(auVar5);
            uVar41 = vmovlpd_avx(auVar4);
            uStack_40 = uVar41;
            bVar22 = Vertex::IsOnSurface(pVStack_524);
            in_stack_fffffffffffff2c8 = local_53c;
            in_stack_fffffffffffff2d0 = TStack_534;
            in_stack_fffffffffffff2d8 = pVStack_52c;
            in_stack_fffffffffffff2e0 = pVStack_524;
            if (bVar22) {
              Vertex::ns(local_53c);
              AbsDot<float>((Vector3<float> *)TStack_534,(Normal3<float> *)local_53c);
              uVar41 = 0;
              SampledSpectrum::operator*=
                        ((SampledSpectrum *)pVStack_524,(Float)((ulong)pVStack_52c >> 0x20));
              in_stack_fffffffffffff2c8 = local_53c;
              in_stack_fffffffffffff2d0 = TStack_534;
              in_stack_fffffffffffff2d8 = pVStack_52c;
              in_stack_fffffffffffff2e0 = pVStack_524;
            }
            bVar22 = SampledSpectrum::operator_cast_to_bool
                               ((SampledSpectrum *)in_stack_fffffffffffff2d8);
            if (bVar22) {
              PVar57 = LightSampleContext::p((LightSampleContext *)in_stack_fffffffffffff2d0);
              auVar3._8_8_ = uVar41;
              auVar3._0_8_ = PVar57.super_Tuple3<pbrt::Point3,_float>._0_8_;
              vmovlpd_avx(auVar3);
              args.super_Tuple3<pbrt::Point3,_float>.z = fVar59;
              args.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar39;
              args.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)((ulong)uVar39 >> 0x20);
              Hash<pbrt::Point3<float>>(args);
              uVar40 = 0;
              uVar41 = 0;
              args_00.super_Tuple3<pbrt::Normal3,_float>.z = fVar59;
              args_00.super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar39;
              args_00.super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar39 >> 0x20);
              Hash<pbrt::Normal3<float>>(args_00);
              RNG::RNG((RNG *)in_stack_fffffffffffff2d0,(uint64_t)in_stack_fffffffffffff2c8,0x7f0350
                      );
              Vertex::GetInteraction(local_4e8);
              SVar58 = Integrator::Tr((Integrator *)
                                      CONCAT17(in_stack_fffffffffffff587,in_stack_fffffffffffff580),
                                      (Interaction *)in_stack_fffffffffffff578,
                                      in_stack_fffffffffffff570,in_stack_fffffffffffff568,
                                      (RNG *)CONCAT44(in_stack_fffffffffffff564,
                                                      in_stack_fffffffffffff560));
              auVar1._8_8_ = uVar41;
              auVar1._0_8_ = SVar58.values.values._8_8_;
              auVar2._8_8_ = uVar40;
              auVar2._0_8_ = SVar58.values.values._0_8_;
              auVar56 = ZEXT856(uVar40);
              vmovlpd_avx(auVar2);
              vmovlpd_avx(auVar1);
              SampledSpectrum::operator*=
                        ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                         (SampledSpectrum *)in_stack_fffffffffffff2d8);
            }
          }
        }
        pstd::optional<pbrt::SampledLight>::~optional((optional<pbrt::SampledLight> *)0x7f0408);
      }
    }
    else {
      bVar22 = Vertex::IsConnectible(in_stack_fffffffffffff2d8);
      if ((bVar22) && (bVar22 = Vertex::IsConnectible(in_stack_fffffffffffff2d8), bVar22)) {
        SVar58 = Vertex::f(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                           in_stack_fffffffffffff394);
        auVar47._0_8_ = SVar58.values.values._8_8_;
        auVar47._8_56_ = auVar56;
        auVar31._0_8_ = SVar58.values.values._0_8_;
        auVar31._8_56_ = auVar42;
        vmovlpd_avx(auVar31._0_16_);
        vmovlpd_avx(auVar47._0_16_);
        SVar58 = SampledSpectrum::operator*
                           ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                            (SampledSpectrum *)in_stack_fffffffffffff2d0);
        auVar48._0_8_ = SVar58.values.values._8_8_;
        auVar48._8_56_ = auVar56;
        auVar32._0_8_ = SVar58.values.values._0_8_;
        auVar32._8_56_ = auVar42;
        vmovlpd_avx(auVar32._0_16_);
        vmovlpd_avx(auVar48._0_16_);
        SVar58 = Vertex::f(in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                           in_stack_fffffffffffff394);
        auVar49._0_8_ = SVar58.values.values._8_8_;
        auVar49._8_56_ = auVar56;
        auVar33._0_8_ = SVar58.values.values._0_8_;
        auVar33._8_56_ = auVar42;
        vmovlpd_avx(auVar33._0_16_);
        vmovlpd_avx(auVar49._0_16_);
        SVar58 = SampledSpectrum::operator*
                           ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                            (SampledSpectrum *)in_stack_fffffffffffff2d0);
        auVar50._0_8_ = SVar58.values.values._8_8_;
        auVar50._8_56_ = auVar56;
        auVar34._0_8_ = SVar58.values.values._0_8_;
        auVar34._8_56_ = auVar42;
        vmovlpd_avx(auVar34._0_16_);
        vmovlpd_avx(auVar50._0_16_);
        SVar58 = SampledSpectrum::operator*
                           ((SampledSpectrum *)in_stack_fffffffffffff2d8,
                            (SampledSpectrum *)in_stack_fffffffffffff2d0);
        auVar51._0_8_ = SVar58.values.values._8_8_;
        auVar51._8_56_ = auVar56;
        auVar35._0_8_ = SVar58.values.values._0_8_;
        auVar35._8_56_ = auVar42;
        local_48 = vmovlpd_avx(auVar35._0_16_);
        uStack_40 = vmovlpd_avx(auVar51._0_16_);
        bVar22 = SampledSpectrum::operator_cast_to_bool
                           ((SampledSpectrum *)in_stack_fffffffffffff2d8);
        if (bVar22) {
          SamplerHandle::SamplerHandle
                    ((SamplerHandle *)in_stack_fffffffffffff2d0,
                     (SamplerHandle *)in_stack_fffffffffffff2c8);
          SVar58 = G(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8,
                     (Vertex *)CONCAT17(in_stack_fffffffffffff3e7,in_stack_fffffffffffff3e0),
                     in_stack_fffffffffffff3d8,in_stack_fffffffffffff3d0);
          auVar52._0_8_ = SVar58.values.values._8_8_;
          auVar52._8_56_ = auVar56;
          auVar36._0_8_ = SVar58.values.values._0_8_;
          auVar36._8_56_ = auVar42;
          vmovlpd_avx(auVar36._0_16_);
          vmovlpd_avx(auVar52._0_16_);
          SampledSpectrum::operator*=
                    ((SampledSpectrum *)in_stack_fffffffffffff2e0,
                     (SampledSpectrum *)in_stack_fffffffffffff2d8);
        }
      }
    }
    *(long *)(*in_FS_OFFSET + -0x360) = *(long *)(*in_FS_OFFSET + -0x360) + 1;
    bVar22 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)in_stack_fffffffffffff2d8);
    if (!bVar22) {
      *(long *)(*in_FS_OFFSET + -0x358) = *(long *)(*in_FS_OFFSET + -0x358) + 1;
    }
    *(long *)(*in_FS_OFFSET + -0x350) =
         (long)(local_34 + local_38 + -2) + *(long *)(*in_FS_OFFSET + -0x350);
    *(long *)(*in_FS_OFFSET + -0x348) = *(long *)(*in_FS_OFFSET + -0x348) + 1;
    if ((long)(local_34 + local_38 + -2) < *(long *)(*in_FS_OFFSET + -0x7a0)) {
      lVar26 = (long)(local_34 + local_38 + -2);
    }
    else {
      lVar26 = *(long *)(*in_FS_OFFSET + -0x7a0);
    }
    *(long *)(*in_FS_OFFSET + -0x7a0) = lVar26;
    if (*(long *)(*in_FS_OFFSET + -0x798) < (long)(local_34 + local_38 + -2)) {
      lVar26 = (long)(local_34 + local_38 + -2);
    }
    else {
      lVar26 = *(long *)(*in_FS_OFFSET + -0x798);
    }
    *(long *)(*in_FS_OFFSET + -0x798) = lVar26;
    bVar22 = SampledSpectrum::operator_cast_to_bool((SampledSpectrum *)in_stack_fffffffffffff2d8);
    if (bVar22) {
      LightSamplerHandle::LightSamplerHandle
                ((LightSamplerHandle *)in_stack_fffffffffffff2d0,
                 (LightSamplerHandle *)in_stack_fffffffffffff2c8);
      FVar60 = MISWeight(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                         in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                         in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8,
                         in_stack_fffffffffffffd10);
    }
    else {
      FVar60 = 0.0;
    }
    auVar42 = (undefined1  [56])0x0;
    SampledSpectrum::operator*=
              ((SampledSpectrum *)in_stack_fffffffffffff2e0,
               (Float)((ulong)in_stack_fffffffffffff2d8 >> 0x20));
    if (in_stack_00000028 != (Float *)0x0) {
      auVar42 = (undefined1  [56])0x0;
      *in_stack_00000028 = FVar60;
    }
    SVar58 = SampledWavelengths::PDF((SampledWavelengths *)in_stack_fffffffffffff2d0);
    auVar53._0_8_ = SVar58.values.values._8_8_;
    auVar53._8_56_ = auVar56;
    auVar37._0_8_ = SVar58.values.values._0_8_;
    auVar37._8_56_ = auVar42;
    vmovlpd_avx(auVar37._0_16_);
    vmovlpd_avx(auVar53._0_16_);
    SVar58 = SafeDiv((SampledSpectrum *)in_stack_fffffffffffff2e0,
                     (SampledSpectrum *)in_stack_fffffffffffff2d8);
    auVar54._0_8_ = SVar58.values.values._8_8_;
    auVar54._8_56_ = auVar56;
    auVar38._0_8_ = SVar58.values.values._0_8_;
    auVar38._8_56_ = auVar42;
    local_10 = vmovlpd_avx(auVar38._0_16_);
    local_8 = vmovlpd_avx(auVar54._0_16_);
  }
  else {
    SampledSpectrum::SampledSpectrum
              ((SampledSpectrum *)in_stack_fffffffffffff2d0,
               (Float)((ulong)in_stack_fffffffffffff2c8 >> 0x20));
  }
  aVar21.values[2] = (float)(undefined4)local_8;
  aVar21.values[3] = (float)local_8._4_4_;
  aVar21.values[0] = (float)(undefined4)local_10;
  aVar21.values[1] = (float)local_10._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar21.values;
}

Assistant:

SampledSpectrum ConnectBDPT(const Integrator &integrator, SampledWavelengths &lambda,
                            Vertex *lightVertices, Vertex *cameraVertices, int s, int t,
                            LightSamplerHandle lightSampler, CameraHandle camera,
                            SamplerHandle sampler, pstd::optional<Point2f> *pRaster,
                            Float *misWeightPtr) {
    SampledSpectrum L(0.f);
    // Ignore invalid connections related to infinite area lights
    if (t > 1 && s != 0 && cameraVertices[t - 1].type == VertexType::Light)
        return SampledSpectrum(0.f);

    // Perform connection and write contribution to _L_
    Vertex sampled;
    if (s == 0) {
        // Interpret the camera subpath as a complete path
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsLight())
            L = pt.Le(integrator.infiniteLights, cameraVertices[t - 2], lambda) * pt.beta;
        DCHECK(!L.HasNaNs());

    } else if (t == 1) {
        // Sample a point on the camera and connect it to the light subpath
        const Vertex &qs = lightVertices[s - 1];
        if (qs.IsConnectible()) {
            pstd::optional<CameraWiSample> cs =
                camera.SampleWi(qs.GetInteraction(), sampler.Get2D(), lambda);
            if (cs) {
                *pRaster = cs->pRaster;
                // Initialize dynamically sampled vertex and _L_ for $t=1$ case
                sampled = Vertex::CreateCamera(camera, cs->pLens, cs->Wi / cs->pdf);
                L = qs.beta * qs.f(sampled, TransportMode::Importance) * sampled.beta;
                if (qs.IsOnSurface())
                    L *= AbsDot(cs->wi, qs.ns());
                DCHECK(!L.HasNaNs());
                // Only check visibility after we know that the path would
                // make a non-zero contribution.
                if (L) {
                    RNG rng(Hash(cs->pRaster), Hash(cs->pLens));
                    L *= integrator.Tr(cs->pRef, cs->pLens, lambda, rng);
                }
            }
        }

    } else if (s == 1) {
        // Sample a point on a light and connect it to the camera subpath
        const Vertex &pt = cameraVertices[t - 1];
        if (pt.IsConnectible()) {
            pstd::optional<SampledLight> sampledLight =
                lightSampler.Sample(sampler.Get1D());

            if (sampledLight) {
                LightHandle light = sampledLight->light;
                Float lightPDF = sampledLight->pdf;

                LightSampleContext ctx;
                if (pt.IsOnSurface())
                    ctx = LightSampleContext(pt.GetInteraction().AsSurface());
                else
                    ctx = LightSampleContext(pt.GetInteraction());
                LightLiSample lightWeight = light.SampleLi(ctx, sampler.Get2D(), lambda);
                if (lightWeight) {
                    EndpointInteraction ei(lightWeight.pLight, light);
                    sampled = Vertex::CreateLight(
                        ei, lightWeight.L / (lightWeight.pdf * lightPDF), 0);
                    sampled.pdfFwd = sampled.PdfLightOrigin(integrator.infiniteLights, pt,
                                                            lightSampler);
                    L = pt.beta * pt.f(sampled, TransportMode::Radiance) * sampled.beta;
                    if (pt.IsOnSurface())
                        L *= AbsDot(lightWeight.wi, pt.ns());
                    // Only check visibility if the path would carry radiance.
                    if (L) {
                        RNG rng(Hash(ctx.p()), Hash(ctx.n));
                        L *= integrator.Tr(pt.GetInteraction(), lightWeight.pLight,
                                           lambda, rng);
                    }
                }
            }
        }

    } else {
        // Handle all other bidirectional connection cases
        const Vertex &qs = lightVertices[s - 1], &pt = cameraVertices[t - 1];
        if (qs.IsConnectible() && pt.IsConnectible()) {
            L = qs.beta * qs.f(pt, TransportMode::Importance) *
                pt.f(qs, TransportMode::Radiance) * pt.beta;
            PBRT_DBG("%s\n",
                     StringPrintf(
                         "General connect s: %d, t: %d, qs: %s, pt: %s, qs.f(pt): %s, "
                         "pt.f(qs): %s, G: %s, dist^2: %f",
                         s, t, qs, pt, qs.f(pt, TransportMode::Importance),
                         pt.f(qs, TransportMode::Radiance),
                         G(integrator, sampler, qs, pt, lambda),
                         DistanceSquared(qs.p(), pt.p()))
                         .c_str());
            if (L)
                L *= G(integrator, sampler, qs, pt, lambda);
        }
    }

    ++totalPaths;
    if (!L)
        ++zeroRadiancePaths;
    ReportValue(pathLength, s + t - 2);
    // Compute MIS weight for connection strategy
    Float misWeight = L ? MISWeight(integrator, lightVertices, cameraVertices, sampled, s,
                                    t, lightSampler)
                        : 0.f;
    PBRT_DBG("MIS weight for (s,t) = (%d, %d) connection: %f\n", s, t, misWeight);
    DCHECK(!IsNaN(misWeight));
    L *= misWeight;
    if (misWeightPtr != nullptr)
        *misWeightPtr = misWeight;

    return SafeDiv(L, lambda.PDF());
}